

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::UpdateTextureID(ImDrawList *this)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  uint uVar5;
  int iVar6;
  ImVec4 *pIVar7;
  ImDrawCmd *pIVar8;
  long lVar9;
  void *pvVar10;
  int iVar11;
  ulong uVar12;
  ImDrawCmd *pIVar13;
  int iVar14;
  undefined1 auVar15 [16];
  
  lVar9 = (long)(this->_TextureIdStack).Size;
  if (lVar9 == 0) {
    pvVar10 = (void *)0x0;
  }
  else {
    pvVar10 = (this->_TextureIdStack).Data[lVar9 + -1];
  }
  uVar5 = (this->CmdBuffer).Size;
  uVar12 = (ulong)uVar5;
  if (uVar12 != 0) {
    if ((int)uVar5 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.h"
                    ,0x395,"value_type &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    pIVar8 = (this->CmdBuffer).Data;
    if ((pIVar8 + (uVar12 - 1) != (ImDrawCmd *)0x0) &&
       (((pIVar8[uVar12 - 1].ElemCount == 0 || (pIVar8[uVar12 - 1].TextureId == pvVar10)) &&
        (pIVar8[uVar12 - 1].UserCallback == (ImDrawCallback)0x0)))) {
      if ((uVar5 != 1) && (pIVar8[uVar12 - 2].TextureId == pvVar10)) {
        lVar9 = (long)(this->_ClipRectStack).Size;
        pIVar7 = &GNullClipRect;
        if (lVar9 != 0) {
          pIVar7 = (this->_ClipRectStack).Data + lVar9 + -1;
        }
        auVar15[0] = -(*(char *)&pIVar7->x == *(char *)&pIVar8[uVar12 - 2].ClipRect.x);
        auVar15[1] = -(*(char *)((long)&pIVar7->x + 1) ==
                      *(char *)((long)&pIVar8[uVar12 - 2].ClipRect.x + 1));
        auVar15[2] = -(*(char *)((long)&pIVar7->x + 2) ==
                      *(char *)((long)&pIVar8[uVar12 - 2].ClipRect.x + 2));
        auVar15[3] = -(*(char *)((long)&pIVar7->x + 3) ==
                      *(char *)((long)&pIVar8[uVar12 - 2].ClipRect.x + 3));
        auVar15[4] = -(*(char *)&pIVar7->y == *(char *)&pIVar8[uVar12 - 2].ClipRect.y);
        auVar15[5] = -(*(char *)((long)&pIVar7->y + 1) ==
                      *(char *)((long)&pIVar8[uVar12 - 2].ClipRect.y + 1));
        auVar15[6] = -(*(char *)((long)&pIVar7->y + 2) ==
                      *(char *)((long)&pIVar8[uVar12 - 2].ClipRect.y + 2));
        auVar15[7] = -(*(char *)((long)&pIVar7->y + 3) ==
                      *(char *)((long)&pIVar8[uVar12 - 2].ClipRect.y + 3));
        auVar15[8] = -(*(char *)&pIVar7->z == *(char *)&pIVar8[uVar12 - 2].ClipRect.z);
        auVar15[9] = -(*(char *)((long)&pIVar7->z + 1) ==
                      *(char *)((long)&pIVar8[uVar12 - 2].ClipRect.z + 1));
        auVar15[10] = -(*(char *)((long)&pIVar7->z + 2) ==
                       *(char *)((long)&pIVar8[uVar12 - 2].ClipRect.z + 2));
        auVar15[0xb] = -(*(char *)((long)&pIVar7->z + 3) ==
                        *(char *)((long)&pIVar8[uVar12 - 2].ClipRect.z + 3));
        auVar15[0xc] = -(*(char *)&pIVar7->w == *(char *)&pIVar8[uVar12 - 2].ClipRect.w);
        auVar15[0xd] = -(*(char *)((long)&pIVar7->w + 1) ==
                        *(char *)((long)&pIVar8[uVar12 - 2].ClipRect.w + 1));
        auVar15[0xe] = -(*(char *)((long)&pIVar7->w + 2) ==
                        *(char *)((long)&pIVar8[uVar12 - 2].ClipRect.w + 2));
        auVar15[0xf] = -(*(char *)((long)&pIVar7->w + 3) ==
                        *(char *)((long)&pIVar8[uVar12 - 2].ClipRect.w + 3));
        if (((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar15[0xf] >> 7) << 0xf) == 0xffff) &&
           (pIVar8[uVar12 - 2].UserCallback == (ImDrawCallback)0x0)) {
          (this->CmdBuffer).Size = uVar5 - 1;
          return;
        }
      }
      pIVar8[uVar12 - 1].TextureId = pvVar10;
      return;
    }
  }
  lVar9 = (long)(this->_ClipRectStack).Size;
  pIVar7 = &GNullClipRect;
  if (lVar9 != 0) {
    pIVar7 = (this->_ClipRectStack).Data + lVar9 + -1;
  }
  fVar4 = pIVar7->x;
  uVar2 = pIVar7->y;
  uVar3 = pIVar7->z;
  lVar9 = (long)(this->_TextureIdStack).Size;
  if (lVar9 == 0) {
    pvVar10 = (void *)0x0;
  }
  else {
    pvVar10 = (this->_TextureIdStack).Data[lVar9 + -1];
  }
  if ((fVar4 <= (float)uVar3) && (fVar1 = pIVar7->w, (float)uVar2 <= fVar1)) {
    iVar6 = (this->CmdBuffer).Size;
    if (iVar6 == (this->CmdBuffer).Capacity) {
      if (iVar6 == 0) {
        iVar11 = 8;
      }
      else {
        iVar11 = iVar6 / 2 + iVar6;
      }
      iVar14 = iVar6 + 1;
      if (iVar6 + 1 < iVar11) {
        iVar14 = iVar11;
      }
      pIVar8 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar14 * 0x30);
      pIVar13 = (this->CmdBuffer).Data;
      if (pIVar13 == (ImDrawCmd *)0x0) {
        pIVar13 = (ImDrawCmd *)0x0;
      }
      else {
        memcpy(pIVar8,pIVar13,(long)(this->CmdBuffer).Size * 0x30);
        pIVar13 = (this->CmdBuffer).Data;
      }
      ImGui::MemFree(pIVar13);
      (this->CmdBuffer).Data = pIVar8;
      (this->CmdBuffer).Capacity = iVar14;
      iVar6 = (this->CmdBuffer).Size;
    }
    else {
      pIVar8 = (this->CmdBuffer).Data;
    }
    (this->CmdBuffer).Size = iVar6 + 1;
    pIVar8[iVar6].ElemCount = 0;
    pIVar8[iVar6].ClipRect.x = fVar4;
    pIVar8[iVar6].ClipRect.y = (float)uVar2;
    pIVar8[iVar6].ClipRect.z = (float)uVar3;
    pIVar8[iVar6].ClipRect.w = fVar1;
    pIVar8[iVar6].TextureId = pvVar10;
    pIVar8[iVar6].UserCallback = (ImDrawCallback)0x0;
    (&pIVar8[iVar6].UserCallback)[1] = (ImDrawCallback)0x0;
    return;
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                ,0xab,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::UpdateTextureID()
{
    // If current command is used with different settings we need to add a new command
    const ImTextureID curr_texture_id = GetCurrentTextureId();
    ImDrawCmd* curr_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && curr_cmd->TextureId != curr_texture_id) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (prev_cmd && prev_cmd->TextureId == curr_texture_id && memcmp(&prev_cmd->ClipRect, &GetCurrentClipRect(), sizeof(ImVec4)) == 0 && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->TextureId = curr_texture_id;
}